

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_set(ggml_compute_params *params,ggml_tensor *dst)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  void *pvVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [24];
  int64_t iVar17;
  char cVar18;
  int iVar19;
  int iVar20;
  size_t sVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  char *pcVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  undefined8 uVar30;
  long lVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  
  pgVar6 = dst->src[0];
  if (pgVar6->type == GGML_TYPE_I32) {
    pgVar7 = dst->src[1];
    cVar18 = ggml_are_same_shape(pgVar6,dst);
    if (cVar18 == '\0') {
      pcVar25 = "ggml_are_same_shape(src0, dst)";
      uVar30 = 0xf8a;
    }
    else {
      cVar18 = ggml_is_contiguous(dst);
      if ((cVar18 == '\0') || (cVar18 = ggml_is_contiguous(pgVar6), cVar18 == '\0')) {
        pcVar25 = "ggml_is_contiguous(dst) && ggml_is_contiguous(src0)";
        uVar30 = 0xf8b;
      }
      else {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = *(ulong *)dst->op_params;
        auVar14 = vpmovsxdq_avx(auVar14);
        iVar2 = dst->op_params[2];
        iVar3 = dst->op_params[3];
        if (dst->op_params[4] == 0) {
          if (params->ith == 0) {
            pvVar8 = pgVar6->data;
            pvVar9 = dst->data;
            sVar21 = ggml_nbytes(dst);
            memcpy(pvVar9,pvVar8,sVar21);
          }
          ggml_barrier(params->threadpool);
        }
        iVar20 = params->nth;
        iVar4 = params->ith;
        iVar19 = ggml_nrows(pgVar7);
        sVar10 = pgVar7->nb[0];
        sVar11 = pgVar7->nb[1];
        auVar16 = *(undefined1 (*) [24])pgVar7->ne;
        auVar33 = *(undefined1 (*) [32])pgVar7->ne;
        uVar5 = (uint)pgVar7->ne[0];
        sVar12 = pgVar7->nb[2];
        sVar13 = pgVar7->nb[3];
        uVar22 = ggml_element_size(pgVar6);
        auVar36._8_56_ = extraout_var_00;
        auVar36._0_8_ = extraout_XMM1_Qa_00;
        auVar34 = vpcmpeqd_avx2(auVar36._0_32_,auVar36._0_32_);
        auVar32._8_8_ = 1;
        auVar32._0_8_ = 1;
        auVar32._16_8_ = 1;
        auVar32._24_8_ = 1;
        auVar32 = vpmaxuq_avx512vl(auVar33,auVar32);
        auVar34 = vpaddq_avx2(auVar32,auVar34);
        auVar32 = vpermq_avx2(ZEXT1632(auVar14),0xd0);
        auVar34 = vpsllq_avx2(auVar34,0x20);
        auVar33 = vpsraq_avx512vl(auVar34,0x20);
        auVar34 = vpblendd_avx2(auVar32,ZEXT832(uVar22),3);
        auVar32 = vpbroadcastq_avx512vl();
        auVar34 = vpblendd_avx2(auVar34,auVar32,0xc0);
        auVar34 = vpmullq_avx512vl(auVar34,auVar33);
        auVar1 = vpaddq_avx(auVar34._0_16_,auVar34._16_16_);
        auVar15 = vpshufd_avx(auVar1,0xee);
        auVar1 = vpaddq_avx(auVar1,auVar15);
        uVar22 = ggml_nbytes(dst);
        if (uVar22 < (ulong)(auVar1._0_8_ + (long)iVar3)) {
          pcVar25 = "offset + im0*nb0 + im1*nb1 + im2*nb2 + im3*nb3 <= ggml_nbytes(dst)";
          uVar30 = 0xfb2;
        }
        else {
          if (sVar10 == 4) {
            iVar20 = (iVar20 + -1 + iVar19) / iVar20;
            lVar26 = (long)iVar4 * (long)iVar20;
            iVar20 = iVar20 + (int)lVar26;
            if (iVar19 <= iVar20) {
              iVar20 = iVar19;
            }
            lVar29 = vpextrq_avx(auVar16._0_16_,1);
            lVar31 = auVar16._16_8_ * lVar29;
            lVar28 = vpextrq_avx(auVar14,1);
            for (; lVar26 < iVar20; lVar26 = lVar26 + 1) {
              lVar27 = (long)(int)(lVar26 / lVar31);
              lVar23 = lVar26 - lVar27 * lVar31;
              lVar24 = (long)(int)(lVar23 % lVar29);
              lVar23 = (long)(int)(lVar23 / lVar29);
              pvVar8 = dst->data;
              pvVar9 = pgVar7->data;
              for (uVar22 = 0; (~((int)uVar5 >> 0x1f) & uVar5) != uVar22; uVar22 = uVar22 + 1) {
                *(undefined4 *)
                 ((long)pvVar8 +
                 uVar22 * 4 +
                 lVar23 * lVar28 + lVar24 * auVar14._0_8_ + lVar27 * iVar2 + (long)iVar3) =
                     *(undefined4 *)
                      ((long)pvVar9 +
                      uVar22 * 4 + lVar24 * sVar11 + lVar27 * sVar13 + lVar23 * sVar12);
              }
            }
            return;
          }
          pcVar25 = "nb10 == sizeof(int32_t)";
          uVar30 = 0xfb4;
        }
      }
    }
  }
  else {
    if (pgVar6->type != GGML_TYPE_F32) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
                 ,0xff3,"fatal error");
    }
    pgVar7 = dst->src[1];
    cVar18 = ggml_are_same_shape(pgVar6,dst);
    if (cVar18 == '\0') {
      pcVar25 = "ggml_are_same_shape(src0, dst)";
      uVar30 = 0xf43;
    }
    else {
      cVar18 = ggml_is_contiguous(dst);
      if ((cVar18 == '\0') || (cVar18 = ggml_is_contiguous(pgVar6), cVar18 == '\0')) {
        pcVar25 = "ggml_is_contiguous(dst) && ggml_is_contiguous(src0)";
        uVar30 = 0xf44;
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)dst->op_params;
        auVar14 = vpmovsxdq_avx(auVar1);
        iVar2 = dst->op_params[3];
        iVar3 = dst->op_params[2];
        if (dst->op_params[4] == 0) {
          if (params->ith == 0) {
            pvVar8 = dst->data;
            pvVar9 = pgVar6->data;
            sVar21 = ggml_nbytes(dst);
            memcpy(pvVar8,pvVar9,sVar21);
          }
          ggml_barrier(params->threadpool);
        }
        iVar20 = params->nth;
        iVar4 = params->ith;
        iVar19 = ggml_nrows(pgVar7);
        sVar10 = pgVar7->nb[1];
        auVar16 = *(undefined1 (*) [24])pgVar7->ne;
        auVar32 = *(undefined1 (*) [32])pgVar7->ne;
        sVar11 = pgVar7->nb[2];
        iVar17 = pgVar7->ne[0];
        sVar12 = pgVar7->nb[0];
        sVar13 = pgVar7->nb[3];
        uVar22 = ggml_element_size(pgVar6);
        auVar35._8_56_ = extraout_var;
        auVar35._0_8_ = extraout_XMM1_Qa;
        auVar34 = vpcmpeqd_avx2(auVar35._0_32_,auVar35._0_32_);
        auVar33._8_8_ = 1;
        auVar33._0_8_ = 1;
        auVar33._16_8_ = 1;
        auVar33._24_8_ = 1;
        auVar32 = vpmaxuq_avx512vl(auVar32,auVar33);
        auVar34 = vpaddq_avx2(auVar32,auVar34);
        auVar32 = vpermq_avx2(ZEXT1632(auVar14),0xd0);
        auVar34 = vpsllq_avx2(auVar34,0x20);
        auVar33 = vpsraq_avx512vl(auVar34,0x20);
        auVar34 = vpblendd_avx2(auVar32,ZEXT832(uVar22),3);
        auVar32 = vpbroadcastq_avx512vl();
        auVar34 = vpblendd_avx2(auVar34,auVar32,0xc0);
        auVar34 = vpmullq_avx512vl(auVar34,auVar33);
        auVar1 = vpaddq_avx(auVar34._0_16_,auVar34._16_16_);
        auVar15 = vpshufd_avx(auVar1,0xee);
        auVar1 = vpaddq_avx(auVar1,auVar15);
        uVar22 = ggml_nbytes(dst);
        if (uVar22 < (ulong)(auVar1._0_8_ + (long)iVar2)) {
          pcVar25 = "offset + im0*nb0 + im1*nb1 + im2*nb2 + im3*nb3 <= ggml_nbytes(dst)";
          uVar30 = 0xf6b;
        }
        else {
          if (sVar12 == 4) {
            iVar20 = (iVar20 + -1 + iVar19) / iVar20;
            lVar26 = vpextrq_avx(auVar16._0_16_,1);
            lVar31 = (long)iVar4 * (long)iVar20;
            iVar20 = iVar20 + (int)lVar31;
            lVar29 = vpextrq_avx(auVar14,1);
            if (iVar19 <= iVar20) {
              iVar20 = iVar19;
            }
            lVar28 = auVar16._16_8_ * lVar26;
            for (; lVar31 < iVar20; lVar31 = lVar31 + 1) {
              lVar24 = (long)(int)(lVar31 / lVar28);
              lVar23 = -lVar28 * lVar24 + lVar31;
              lVar27 = (long)(int)(lVar23 % lVar26);
              lVar23 = (long)(int)(lVar23 / lVar26);
              ggml_vec_cpy_f32((int)iVar17,
                               (float *)((long)dst->data +
                                        lVar23 * lVar29 +
                                        (long)iVar2 + lVar27 * auVar14._0_8_ + lVar24 * iVar3),
                               (float *)((long)pgVar7->data +
                                        lVar23 * sVar11 + lVar27 * sVar10 + lVar24 * sVar13));
            }
            return;
          }
          pcVar25 = "nb10 == sizeof(float)";
          uVar30 = 0xf6d;
        }
      }
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
             ,uVar30,"GGML_ASSERT(%s) failed",pcVar25);
}

Assistant:

void ggml_compute_forward_set(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_set_f32(params, dst);
            } break;
        case GGML_TYPE_I32:
            {
                ggml_compute_forward_set_i32(params, dst);
            } break;
        case GGML_TYPE_F16:
        case GGML_TYPE_BF16:
        case GGML_TYPE_Q4_0:
        case GGML_TYPE_Q4_1:
        case GGML_TYPE_Q5_0:
        case GGML_TYPE_Q5_1:
        case GGML_TYPE_Q8_0:
        case GGML_TYPE_Q8_1:
        case GGML_TYPE_Q2_K:
        case GGML_TYPE_Q3_K:
        case GGML_TYPE_Q4_K:
        case GGML_TYPE_Q5_K:
        case GGML_TYPE_Q6_K:
        case GGML_TYPE_TQ1_0:
        case GGML_TYPE_TQ2_0:
        case GGML_TYPE_IQ2_XXS:
        case GGML_TYPE_IQ2_XS:
        case GGML_TYPE_IQ3_XXS:
        case GGML_TYPE_IQ1_S:
        case GGML_TYPE_IQ1_M:
        case GGML_TYPE_IQ4_NL:
        case GGML_TYPE_IQ4_XS:
        case GGML_TYPE_IQ3_S:
        case GGML_TYPE_IQ2_S:
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}